

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O3

ion_status_t bpptree_insert(ion_dictionary_t *dictionary,ion_key_t key,ion_value_t value)

{
  ion_value_size_t *bag;
  ion_dictionary_parent_t *piVar1;
  ion_err_t iVar2;
  ion_bpp_err_t iVar3;
  ion_status_t iVar4;
  ion_file_offset_t offset;
  ion_bpp_external_address_t local_20;
  ion_status_t iVar5;
  ion_status_t iVar6;
  
  piVar1 = dictionary->instance;
  local_20 = -1;
  iVar3 = b_get(*(ion_bpp_handle_t *)(piVar1 + 1),key,&local_20);
  bag = &piVar1[1].record.value_size;
  if (iVar3 == bErrKeyNotFound) {
    local_20 = -1;
    iVar2 = lfb_put((ion_lfb_t *)bag,(ion_byte_t *)value,(piVar1->record).value_size,-1,&local_20);
    if (iVar2 != '\0') {
      iVar6.error = '\f';
      iVar6._1_3_ = 0;
      iVar6.count = 0;
      return iVar6;
    }
    iVar3 = b_insert(*(ion_bpp_handle_t *)(piVar1 + 1),key,local_20);
  }
  else {
    iVar2 = lfb_put((ion_lfb_t *)bag,(ion_byte_t *)value,(piVar1->record).value_size,local_20,
                    &local_20);
    if (iVar2 != '\0') {
      iVar5.error = '\f';
      iVar5._1_3_ = 0;
      iVar5.count = 0;
      return iVar5;
    }
    iVar3 = b_update(*(ion_bpp_handle_t *)(piVar1 + 1),key,local_20);
  }
  iVar4.error = '\f';
  iVar4._1_3_ = 0;
  iVar4.count = 0;
  if (iVar3 == bErrOk) {
    iVar4.error = '\0';
    iVar4._1_3_ = 0;
    iVar4.count = 1;
  }
  return iVar4;
}

Assistant:

ion_status_t
bpptree_insert(
	ion_dictionary_t	*dictionary,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_bpptree_t		*bpptree;
	ion_bpp_err_t		bErr;
	ion_err_t			err;
	ion_file_offset_t	offset;

	bpptree = (ion_bpptree_t *) dictionary->instance;

	offset	= ION_FILE_NULL;
	bErr	= b_get(bpptree->tree, key, &offset);

	if (bErrKeyNotFound == bErr) {
		offset = ION_FILE_NULL;
	}

	err = lfb_put(&(bpptree->values), (ion_byte_t *) value, bpptree->super.record.value_size, offset, &offset);

	if (err_ok == err) {
		if (bErrKeyNotFound == bErr) {
			bErr = b_insert(bpptree->tree, key, offset);
		}
		else {
			bErr = b_update(bpptree->tree, key, offset);
		}

		if (bErrOk != bErr) {
			return ION_STATUS_ERROR(err_unable_to_insert);
		}

		return ION_STATUS_OK(1);
	}
	else {
		return ION_STATUS_ERROR(err_unable_to_insert);
	}
}